

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_sortaddrinfo.c
# Opt level: O3

int rfc6724_compare(void *ptr1,void *ptr2)

{
  int iVar1;
  sockaddr *addr;
  sockaddr *addr_00;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  size_t i;
  long lVar9;
  byte bVar10;
  bool bVar11;
  
  iVar1 = *(int *)((long)ptr1 + 8);
  iVar2 = *(int *)((long)ptr2 + 8) - iVar1;
  if (iVar2 == 0) {
    iVar4 = 1;
    iVar2 = 1;
    if (iVar1 != 0) {
      iVar2 = get_scope((sockaddr *)((long)ptr1 + 0xc));
    }
    addr = *(sockaddr **)(*ptr1 + 0x18);
    iVar3 = get_scope(addr);
    if (iVar1 != 0) {
      iVar4 = get_scope((sockaddr *)((long)ptr2 + 0xc));
    }
    addr_00 = *(sockaddr **)(*ptr2 + 0x18);
    iVar5 = get_scope(addr_00);
    if ((iVar2 == iVar3) == (iVar4 == iVar5)) {
      if (iVar1 == 0) {
        iVar2 = get_label(addr);
        bVar11 = iVar2 == 1;
        iVar2 = 1;
      }
      else {
        iVar2 = get_label((sockaddr *)((long)ptr1 + 0xc));
        iVar4 = get_label(addr);
        bVar11 = iVar2 == iVar4;
        iVar2 = get_label((sockaddr *)((long)ptr2 + 0xc));
      }
      iVar4 = get_label(addr_00);
      if (bVar11 == (iVar2 == iVar4)) {
        iVar4 = get_precedence(addr);
        iVar2 = get_precedence(addr_00);
        iVar2 = iVar2 - iVar4;
        if ((iVar2 == 0) && (iVar2 = iVar3 - iVar5, iVar2 == 0)) {
          if ((iVar1 != 0) && ((addr->sa_family == 10 && (addr_00->sa_family == 10)))) {
            lVar6 = 0;
            lVar9 = 0;
            do {
              bVar10 = *(byte *)((long)ptr1 + lVar9 + 0x14);
              if (bVar10 != addr->sa_data[lVar9 + 6]) {
                bVar10 = addr->sa_data[lVar9 + 6] ^ bVar10;
                lVar8 = 0;
                do {
                  if ((char)bVar10 < '\0') {
                    lVar8 = lVar8 - lVar6;
                    goto LAB_00116e15;
                  }
                  bVar10 = bVar10 * '\x02';
                  lVar8 = lVar8 + 1;
                } while (lVar8 != 8);
              }
              lVar9 = lVar9 + 1;
              lVar6 = lVar6 + -8;
            } while (lVar9 != 0x10);
            lVar8 = 0x80;
LAB_00116e15:
            lVar6 = 0;
            lVar9 = 0;
            do {
              bVar10 = *(byte *)((long)ptr2 + lVar9 + 0x14);
              if (bVar10 != addr_00->sa_data[lVar9 + 6]) {
                bVar10 = addr_00->sa_data[lVar9 + 6] ^ bVar10;
                lVar7 = 0;
                do {
                  if ((char)bVar10 < '\0') {
                    lVar7 = lVar7 - lVar6;
                    goto LAB_00116e55;
                  }
                  bVar10 = bVar10 * '\x02';
                  lVar7 = lVar7 + 1;
                } while (lVar7 != 8);
              }
              lVar9 = lVar9 + 1;
              lVar6 = lVar6 + -8;
            } while (lVar9 != 0x10);
            lVar7 = 0x80;
LAB_00116e55:
            if (lVar8 != lVar7) {
              return (int)lVar7 - (int)lVar8;
            }
          }
          iVar2 = *(int *)((long)ptr1 + 0x28) - *(int *)((long)ptr2 + 0x28);
        }
      }
      else {
        iVar2 = (uint)(iVar2 == iVar4) - (uint)bVar11;
      }
    }
    else {
      iVar2 = (uint)(iVar4 == iVar5) - (uint)(iVar2 == iVar3);
    }
  }
  return iVar2;
}

Assistant:

static int rfc6724_compare(const void *ptr1, const void *ptr2)
{
  const struct addrinfo_sort_elem *a1 = (const struct addrinfo_sort_elem *)ptr1;
  const struct addrinfo_sort_elem *a2 = (const struct addrinfo_sort_elem *)ptr2;
  int                              scope_src1;
  int                              scope_dst1;
  int                              scope_match1;
  int                              scope_src2;
  int                              scope_dst2;
  int                              scope_match2;
  int                              label_src1;
  int                              label_dst1;
  int                              label_match1;
  int                              label_src2;
  int                              label_dst2;
  int                              label_match2;
  int                              precedence1;
  int                              precedence2;
  size_t                           prefixlen1;
  size_t                           prefixlen2;

  /* Rule 1: Avoid unusable destinations. */
  if (a1->has_src_addr != a2->has_src_addr) {
    return ((int)a2->has_src_addr) - ((int)a1->has_src_addr);
  }

  /* Rule 2: Prefer matching scope. */
  scope_src1 = ARES_IPV6_ADDR_SCOPE_NODELOCAL;
  if (a1->has_src_addr) {
    scope_src1 = get_scope(&a1->src_addr.sa);
  }
  scope_dst1   = get_scope(a1->ai->ai_addr);
  scope_match1 = (scope_src1 == scope_dst1);

  scope_src2 = ARES_IPV6_ADDR_SCOPE_NODELOCAL;
  if (a2->has_src_addr) {
    scope_src2 = get_scope(&a2->src_addr.sa);
  }
  scope_dst2   = get_scope(a2->ai->ai_addr);
  scope_match2 = (scope_src2 == scope_dst2);

  if (scope_match1 != scope_match2) {
    return scope_match2 - scope_match1;
  }

  /* Rule 3: Avoid deprecated addresses.  */

  /* Rule 4: Prefer home addresses.  */

  /* Rule 5: Prefer matching label. */
  label_src1 = 1;
  if (a1->has_src_addr) {
    label_src1 = get_label(&a1->src_addr.sa);
  }
  label_dst1   = get_label(a1->ai->ai_addr);
  label_match1 = (label_src1 == label_dst1);

  label_src2 = 1;
  if (a2->has_src_addr) {
    label_src2 = get_label(&a2->src_addr.sa);
  }
  label_dst2   = get_label(a2->ai->ai_addr);
  label_match2 = (label_src2 == label_dst2);

  if (label_match1 != label_match2) {
    return label_match2 - label_match1;
  }

  /* Rule 6: Prefer higher precedence. */
  precedence1 = get_precedence(a1->ai->ai_addr);
  precedence2 = get_precedence(a2->ai->ai_addr);
  if (precedence1 != precedence2) {
    return precedence2 - precedence1;
  }

  /* Rule 7: Prefer native transport.  */

  /* Rule 8: Prefer smaller scope. */
  if (scope_dst1 != scope_dst2) {
    return scope_dst1 - scope_dst2;
  }

  /* Rule 9: Use longest matching prefix. */
  if (a1->has_src_addr && a1->ai->ai_addr->sa_family == AF_INET6 &&
      a2->has_src_addr && a2->ai->ai_addr->sa_family == AF_INET6) {
    const struct sockaddr_in6 *a1_src = &a1->src_addr.sa6;
    const struct sockaddr_in6 *a1_dst =
      CARES_INADDR_CAST(const struct sockaddr_in6 *, a1->ai->ai_addr);
    const struct sockaddr_in6 *a2_src = &a2->src_addr.sa6;
    const struct sockaddr_in6 *a2_dst =
      CARES_INADDR_CAST(const struct sockaddr_in6 *, a2->ai->ai_addr);
    prefixlen1 = common_prefix_len(&a1_src->sin6_addr, &a1_dst->sin6_addr);
    prefixlen2 = common_prefix_len(&a2_src->sin6_addr, &a2_dst->sin6_addr);
    if (prefixlen1 != prefixlen2) {
      return (int)prefixlen2 - (int)prefixlen1;
    }
  }

  /*
   * Rule 10: Leave the order unchanged.
   * We need this since qsort() is not necessarily stable.
   */
  return ((int)a1->original_order) - ((int)a2->original_order);
}